

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_avx2.c
# Opt level: O0

void aom_filter_block1d16_h4_avx2
               (uint8_t *src_ptr,ptrdiff_t src_pixels_per_line,uint8_t *output_ptr,
               ptrdiff_t output_pitch,uint32_t output_height,int16_t *filter)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 (*in_R9) [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar15 [16];
  undefined1 auVar14 [64];
  __m256i srcRegFilt1_1;
  __m256i srcRegFilt3;
  __m256i srcRegFilt2;
  __m256i srcReg12;
  __m256i srcReg1;
  ptrdiff_t dst_stride;
  ptrdiff_t src_stride;
  uint i;
  __m256i filtersReg32;
  __m256i srcReg32b2;
  __m256i srcReg32b1;
  __m256i srcRegFilt32b3;
  __m256i srcRegFilt32b2;
  __m256i srcRegFilt32b2_1;
  __m256i srcRegFilt32b1_1;
  __m256i thirdFilters;
  __m256i secondFilters;
  __m256i filt3Reg;
  __m256i filt2Reg;
  __m256i addFilterReg32;
  __m128i filtersReg;
  __m256i *in_stack_fffffffffffff540;
  ptrdiff_t in_stack_fffffffffffff548;
  uint8_t *in_stack_fffffffffffff550;
  undefined1 in_stack_fffffffffffff560 [32];
  uint local_9e4;
  undefined8 *local_830;
  undefined1 (*local_820) [32];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar9 = filt_global_avx2._64_32_;
  local_820 = (undefined1 (*) [32])(in_RDI + -3);
  auVar1 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar1 = vpinsrw_avx(auVar1,0x20,2);
  auVar1 = vpinsrw_avx(auVar1,0x20,3);
  auVar1 = vpinsrw_avx(auVar1,0x20,4);
  auVar1 = vpinsrw_avx(auVar1,0x20,5);
  auVar1 = vpinsrw_avx(auVar1,0x20,6);
  auVar1 = vpinsrw_avx(auVar1,0x20,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar2 = vpinsrw_avx(auVar2,0x20,2);
  auVar2 = vpinsrw_avx(auVar2,0x20,3);
  auVar2 = vpinsrw_avx(auVar2,0x20,4);
  auVar2 = vpinsrw_avx(auVar2,0x20,5);
  auVar2 = vpinsrw_avx(auVar2,0x20,6);
  auVar2 = vpinsrw_avx(auVar2,0x20,7);
  uStack_f0 = auVar2._0_8_;
  uStack_e8 = auVar2._8_8_;
  auVar2 = vpsraw_avx(*in_R9,ZEXT416(1));
  vpacksswb_avx(auVar2,auVar2);
  auVar2 = vpinsrw_avx(ZEXT216(0x302),0x302,1);
  auVar2 = vpinsrw_avx(auVar2,0x302,2);
  auVar2 = vpinsrw_avx(auVar2,0x302,3);
  auVar2 = vpinsrw_avx(auVar2,0x302,4);
  auVar2 = vpinsrw_avx(auVar2,0x302,5);
  auVar2 = vpinsrw_avx(auVar2,0x302,6);
  auVar2 = vpinsrw_avx(auVar2,0x302,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x302),0x302,1);
  auVar3 = vpinsrw_avx(auVar3,0x302,2);
  auVar3 = vpinsrw_avx(auVar3,0x302,3);
  auVar3 = vpinsrw_avx(auVar3,0x302,4);
  auVar3 = vpinsrw_avx(auVar3,0x302,5);
  auVar3 = vpinsrw_avx(auVar3,0x302,6);
  auVar3 = vpinsrw_avx(auVar3,0x302,7);
  uStack_b0 = auVar3._0_8_;
  uStack_a8 = auVar3._8_8_;
  auVar6._8_8_ = uStack_7b8;
  auVar6._0_8_ = local_7c0;
  auVar6._16_8_ = local_7c0;
  auVar6._24_8_ = uStack_7b8;
  auVar4._16_8_ = uStack_b0;
  auVar4._0_16_ = auVar2;
  auVar4._24_8_ = uStack_a8;
  auVar4 = vpshufb_avx2(auVar6,auVar4);
  auVar2 = vpinsrw_avx(ZEXT216(0x504),0x504,1);
  auVar2 = vpinsrw_avx(auVar2,0x504,2);
  auVar2 = vpinsrw_avx(auVar2,0x504,3);
  auVar2 = vpinsrw_avx(auVar2,0x504,4);
  auVar2 = vpinsrw_avx(auVar2,0x504,5);
  auVar2 = vpinsrw_avx(auVar2,0x504,6);
  auVar2 = vpinsrw_avx(auVar2,0x504,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x504),0x504,1);
  auVar3 = vpinsrw_avx(auVar3,0x504,2);
  auVar3 = vpinsrw_avx(auVar3,0x504,3);
  auVar3 = vpinsrw_avx(auVar3,0x504,4);
  auVar3 = vpinsrw_avx(auVar3,0x504,5);
  auVar3 = vpinsrw_avx(auVar3,0x504,6);
  auVar3 = vpinsrw_avx(auVar3,0x504,7);
  auVar15 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  uStack_70 = auVar15._0_8_;
  uStack_68 = auVar15._8_8_;
  auVar12._8_8_ = uStack_7b8;
  auVar12._0_8_ = local_7c0;
  auVar12._16_8_ = local_7c0;
  auVar12._24_8_ = uStack_7b8;
  auVar5._16_8_ = uStack_70;
  auVar5._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar5._24_8_ = uStack_68;
  auVar5 = vpshufb_avx2(auVar12,auVar5);
  auVar14 = ZEXT3264(filt_global_avx2._64_32_);
  local_830 = in_RDX;
  for (local_9e4 = in_R8D; auVar12 = auVar14._0_32_, 1 < local_9e4; local_9e4 = local_9e4 - 2) {
    yy_loadu2_128(in_stack_fffffffffffff560._8_8_,in_stack_fffffffffffff560._0_8_);
    auVar8[8] = '\x06';
    auVar8[9] = '\a';
    auVar8[10] = '\a';
    auVar8[0xb] = '\b';
    auVar8[0xc] = '\b';
    auVar8[0xd] = '\t';
    auVar8[0xe] = '\t';
    auVar8[0xf] = '\n';
    auVar8[0] = '\x02';
    auVar8[1] = '\x03';
    auVar8[2] = '\x03';
    auVar8[3] = '\x04';
    auVar8[4] = '\x04';
    auVar8[5] = '\x05';
    auVar8[6] = '\x05';
    auVar8[7] = '\x06';
    auVar8[0x10] = '\x02';
    auVar8[0x11] = '\x03';
    auVar8[0x12] = '\x03';
    auVar8[0x13] = '\x04';
    auVar8[0x14] = '\x04';
    auVar8[0x15] = '\x05';
    auVar8[0x16] = '\x05';
    auVar8[0x17] = '\x06';
    auVar8[0x18] = '\x06';
    auVar8[0x19] = '\a';
    auVar8[0x1a] = '\a';
    auVar8[0x1b] = '\b';
    auVar8[0x1c] = '\b';
    auVar8[0x1d] = '\t';
    auVar8[0x1e] = '\t';
    auVar8[0x1f] = '\n';
    auVar6 = vpshufb_avx2(auVar12,auVar8);
    auVar13 = vpshufb_avx2(auVar12,auVar9);
    auVar12 = vpmaddubsw_avx2(auVar6,auVar4);
    auVar6 = vpmaddubsw_avx2(auVar13,auVar5);
    auVar12 = vpaddsw_avx2(auVar12,auVar6);
    auVar13 = auVar12;
    yy_loadu2_128(in_stack_fffffffffffff560._8_8_,in_stack_fffffffffffff560._0_8_);
    auVar7[8] = '\x06';
    auVar7[9] = '\a';
    auVar7[10] = '\a';
    auVar7[0xb] = '\b';
    auVar7[0xc] = '\b';
    auVar7[0xd] = '\t';
    auVar7[0xe] = '\t';
    auVar7[0xf] = '\n';
    auVar7[0] = '\x02';
    auVar7[1] = '\x03';
    auVar7[2] = '\x03';
    auVar7[3] = '\x04';
    auVar7[4] = '\x04';
    auVar7[5] = '\x05';
    auVar7[6] = '\x05';
    auVar7[7] = '\x06';
    auVar7[0x10] = '\x02';
    auVar7[0x11] = '\x03';
    auVar7[0x12] = '\x03';
    auVar7[0x13] = '\x04';
    auVar7[0x14] = '\x04';
    auVar7[0x15] = '\x05';
    auVar7[0x16] = '\x05';
    auVar7[0x17] = '\x06';
    auVar7[0x18] = '\x06';
    auVar7[0x19] = '\a';
    auVar7[0x1a] = '\a';
    auVar7[0x1b] = '\b';
    auVar7[0x1c] = '\b';
    auVar7[0x1d] = '\t';
    auVar7[0x1e] = '\t';
    auVar7[0x1f] = '\n';
    auVar6 = vpshufb_avx2(auVar13,auVar7);
    auVar13 = vpshufb_avx2(auVar13,auVar9);
    auVar6 = vpmaddubsw_avx2(auVar6,auVar4);
    auVar13 = vpmaddubsw_avx2(auVar13,auVar5);
    auVar6 = vpaddsw_avx2(auVar6,auVar13);
    auVar11._16_8_ = uStack_f0;
    auVar11._0_16_ = auVar1;
    auVar11._24_8_ = uStack_e8;
    auVar12 = vpaddsw_avx2(auVar12,auVar11);
    auVar10._16_8_ = uStack_f0;
    auVar10._0_16_ = auVar1;
    auVar10._24_8_ = uStack_e8;
    auVar6 = vpaddsw_avx2(auVar6,auVar10);
    auVar12 = vpsraw_avx2(auVar12,ZEXT416(6));
    auVar6 = vpsraw_avx2(auVar6,ZEXT416(6));
    auVar12 = vpackuswb_avx2(auVar12,auVar6);
    local_820 = (undefined1 (*) [32])(*local_820 + in_RSI * 2);
    auVar14 = ZEXT1664(auVar12._0_16_);
    xx_store2_mi128(in_stack_fffffffffffff550,in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    local_830 = (undefined8 *)(in_RCX * 2 + (long)local_830);
  }
  if (local_9e4 != 0) {
    auVar6 = vpermq_avx2(*local_820,0x94);
    auVar13[8] = '\x06';
    auVar13[9] = '\a';
    auVar13[10] = '\a';
    auVar13[0xb] = '\b';
    auVar13[0xc] = '\b';
    auVar13[0xd] = '\t';
    auVar13[0xe] = '\t';
    auVar13[0xf] = '\n';
    auVar13[0] = '\x02';
    auVar13[1] = '\x03';
    auVar13[2] = '\x03';
    auVar13[3] = '\x04';
    auVar13[4] = '\x04';
    auVar13[5] = '\x05';
    auVar13[6] = '\x05';
    auVar13[7] = '\x06';
    auVar13[0x10] = '\x02';
    auVar13[0x11] = '\x03';
    auVar13[0x12] = '\x03';
    auVar13[0x13] = '\x04';
    auVar13[0x14] = '\x04';
    auVar13[0x15] = '\x05';
    auVar13[0x16] = '\x05';
    auVar13[0x17] = '\x06';
    auVar13[0x18] = '\x06';
    auVar13[0x19] = '\a';
    auVar13[0x1a] = '\a';
    auVar13[0x1b] = '\b';
    auVar13[0x1c] = '\b';
    auVar13[0x1d] = '\t';
    auVar13[0x1e] = '\t';
    auVar13[0x1f] = '\n';
    auVar12 = vpshufb_avx2(auVar6,auVar13);
    auVar6 = vpshufb_avx2(auVar6,auVar9);
    auVar4 = vpmaddubsw_avx2(auVar12,auVar4);
    auVar5 = vpmaddubsw_avx2(auVar6,auVar5);
    auVar4 = vpaddsw_avx2(auVar4,auVar5);
    auVar9._16_8_ = uStack_f0;
    auVar9._0_16_ = auVar1;
    auVar9._24_8_ = uStack_e8;
    auVar4 = vpaddsw_avx2(auVar4,auVar9);
    auVar4 = vpsraw_avx2(auVar4,ZEXT416(6));
    auVar4 = vpackuswb_avx2(auVar4,auVar4);
    auVar4 = vpermq_avx2(auVar4,8);
    *local_830 = auVar4._0_8_;
    local_830[1] = auVar4._8_8_;
  }
  return;
}

Assistant:

static void aom_filter_block1d16_h4_avx2(
    const uint8_t *src_ptr, ptrdiff_t src_pixels_per_line, uint8_t *output_ptr,
    ptrdiff_t output_pitch, uint32_t output_height, const int16_t *filter) {
  __m128i filtersReg;
  __m256i addFilterReg32, filt2Reg, filt3Reg;
  __m256i secondFilters, thirdFilters;
  __m256i srcRegFilt32b1_1, srcRegFilt32b2_1, srcRegFilt32b2, srcRegFilt32b3;
  __m256i srcReg32b1, srcReg32b2, filtersReg32;
  unsigned int i;
  ptrdiff_t src_stride, dst_stride;
  src_ptr -= 3;
  addFilterReg32 = _mm256_set1_epi16(32);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);
  filtersReg = _mm_srai_epi16(filtersReg, 1);
  // converting the 16 bit (short) to 8 bit (byte) and have the same data
  // in both lanes of 128 bit register.
  filtersReg = _mm_packs_epi16(filtersReg, filtersReg);
  // have the same data in both lanes of a 256 bit register
  filtersReg32 = MM256_BROADCASTSI128_SI256(filtersReg);

  // duplicate only the second 16 bits (third and forth byte)
  // across 256 bit register
  secondFilters = _mm256_shuffle_epi8(filtersReg32, _mm256_set1_epi16(0x302u));
  // duplicate only the third 16 bits (fifth and sixth byte)
  // across 256 bit register
  thirdFilters = _mm256_shuffle_epi8(filtersReg32, _mm256_set1_epi16(0x504u));

  filt2Reg = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32));
  filt3Reg = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));

  // multiply the size of the source and destination stride by two
  src_stride = src_pixels_per_line << 1;
  dst_stride = output_pitch << 1;
  for (i = output_height; i > 1; i -= 2) {
    // load the 2 strides of source
    srcReg32b1 = yy_loadu2_128(src_ptr + src_pixels_per_line, src_ptr);

    // filter the source buffer
    srcRegFilt32b3 = _mm256_shuffle_epi8(srcReg32b1, filt2Reg);
    srcRegFilt32b2 = _mm256_shuffle_epi8(srcReg32b1, filt3Reg);

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt32b3 = _mm256_maddubs_epi16(srcRegFilt32b3, secondFilters);
    srcRegFilt32b2 = _mm256_maddubs_epi16(srcRegFilt32b2, thirdFilters);

    srcRegFilt32b1_1 = _mm256_adds_epi16(srcRegFilt32b3, srcRegFilt32b2);

    // reading 2 strides of the next 16 bytes
    // (part of it was being read by earlier read)
    srcReg32b2 = yy_loadu2_128(src_ptr + src_pixels_per_line + 8, src_ptr + 8);

    // filter the source buffer
    srcRegFilt32b3 = _mm256_shuffle_epi8(srcReg32b2, filt2Reg);
    srcRegFilt32b2 = _mm256_shuffle_epi8(srcReg32b2, filt3Reg);

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt32b3 = _mm256_maddubs_epi16(srcRegFilt32b3, secondFilters);
    srcRegFilt32b2 = _mm256_maddubs_epi16(srcRegFilt32b2, thirdFilters);

    // add and saturate the results together
    srcRegFilt32b2_1 = _mm256_adds_epi16(srcRegFilt32b3, srcRegFilt32b2);

    // shift by 6 bit each 16 bit
    srcRegFilt32b1_1 = _mm256_adds_epi16(srcRegFilt32b1_1, addFilterReg32);
    srcRegFilt32b2_1 = _mm256_adds_epi16(srcRegFilt32b2_1, addFilterReg32);
    srcRegFilt32b1_1 = _mm256_srai_epi16(srcRegFilt32b1_1, 6);
    srcRegFilt32b2_1 = _mm256_srai_epi16(srcRegFilt32b2_1, 6);

    // shrink to 8 bit each 16 bits, the first lane contain the first
    // convolve result and the second lane contain the second convolve result
    srcRegFilt32b1_1 = _mm256_packus_epi16(srcRegFilt32b1_1, srcRegFilt32b2_1);

    src_ptr += src_stride;

    xx_store2_mi128(output_ptr, output_pitch, &srcRegFilt32b1_1);
    output_ptr += dst_stride;
  }

  // if the number of strides is odd.
  // process only 16 bytes
  if (i > 0) {
    __m256i srcReg1, srcReg12;
    __m256i srcRegFilt2, srcRegFilt3, srcRegFilt1_1;

    srcReg1 = _mm256_loadu_si256((const __m256i *)(src_ptr));
    srcReg12 = _mm256_permute4x64_epi64(srcReg1, 0x94);

    // filter the source buffer
    srcRegFilt2 = _mm256_shuffle_epi8(srcReg12, filt2Reg);
    srcRegFilt3 = _mm256_shuffle_epi8(srcReg12, filt3Reg);

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt2 = _mm256_maddubs_epi16(srcRegFilt2, secondFilters);
    srcRegFilt3 = _mm256_maddubs_epi16(srcRegFilt3, thirdFilters);

    // add and saturate the results together
    srcRegFilt1_1 = _mm256_adds_epi16(srcRegFilt2, srcRegFilt3);

    // shift by 6 bit each 16 bit
    srcRegFilt1_1 = _mm256_adds_epi16(srcRegFilt1_1, addFilterReg32);
    srcRegFilt1_1 = _mm256_srai_epi16(srcRegFilt1_1, 6);

    // shrink to 8 bit each 16 bits, the first lane contain the first
    // convolve result and the second lane contain the second convolve
    // result
    srcRegFilt1_1 = _mm256_packus_epi16(srcRegFilt1_1, srcRegFilt1_1);
    srcRegFilt1_1 = _mm256_permute4x64_epi64(srcRegFilt1_1, 0x8);

    // save 16 bytes
    _mm_store_si128((__m128i *)output_ptr,
                    _mm256_castsi256_si128(srcRegFilt1_1));
  }
}